

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::operator+(String *__return_storage_ptr__,String *lhs,String *rhs)

{
  EVP_PKEY_CTX *src;
  uint uVar1;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if ((lhs->field_0).buf[0x17] < '\0') {
    local_38.buf[0x17] = 0x80;
    local_38.data.size = (lhs->field_0).data.size;
    uVar1 = local_38.data.size + 1;
    local_38.data.capacity = uVar1;
    local_38.data.ptr = (char *)operator_new__((ulong)uVar1);
    memcpy(local_38.data.ptr,(lhs->field_0).data.ptr,(ulong)uVar1);
  }
  else {
    local_38._16_8_ = *(long *)((long)&lhs->field_0 + 0x10);
    local_38.data.ptr = (lhs->field_0).data.ptr;
    local_38._8_8_ = *(undefined8 *)((long)&lhs->field_0 + 8);
  }
  String::operator+=((String *)&local_38.data,rhs);
  String::copy(__return_storage_ptr__,(EVP_PKEY_CTX *)&local_38.data,src);
  if (((long)local_38._16_8_ < 0) && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& lhs, const String& rhs) { return  String(lhs) += rhs; }